

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O0

HalfCycles __thiscall
Atari::ST::ConcreteMachine::perform_bus_operation<CPU::MC68000::Microcycle<325u>>
          (ConcreteMachine *this,Microcycle<325U> *cycle,int is_supervisor)

{
  uint8_t v;
  bool bVar1;
  uint uVar2;
  pointer this_00;
  pointer this_01;
  HalfCycles HVar3;
  pointer this_02;
  pointer this_03;
  ssize_t sVar4;
  uint *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *local_200;
  undefined1 local_110 [24];
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *acia_;
  undefined1 local_e8 [24];
  HalfCycles local_d0 [3];
  undefined1 local_b8 [32];
  undefined1 local_98 [24];
  uint8_t *memory;
  Time TStack_68;
  int i_phase;
  HalfCycles delay;
  uint32_t address;
  int interrupt;
  int interrupt_level;
  int is_supervisor_local;
  Microcycle<325U> *cycle_local;
  ConcreteMachine *this_local;
  
  CPU::MC68000::Processor<Atari::ST::ConcreteMachine,_true,_true,_false>::set_is_peripheral_address
            (&this->mc68000_,false);
  CPU::MC68000::Processor<Atari::ST::ConcreteMachine,_true,_true,_false>::set_bus_error
            (&this->mc68000_,false);
  advance_time(this,(HalfCycles)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  delay.super_WrappedInt<HalfCycles>.length_._0_4_ =
       CPU::MC68000::Microcycle<325U>::host_endian_byte_address(cycle);
  HalfCycles::HalfCycles((HalfCycles *)&stack0xffffffffffffff98,0);
  local_98._16_8_ = (pointer)0x0;
  __nbytes = &switchD_006d60eb::switchdataD_00a4c934;
  switch(this->memory_map_[delay.super_WrappedInt<HalfCycles>.length_._2_2_]) {
  default:
    local_98._16_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->ram_);
    break;
  case Floating:
  case Cartridge:
  case Unassigned:
    (cycle->value->field_1).b = 0xff;
    return (HalfCycles)TStack_68;
  case ROM:
    local_98._16_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom_);
    delay.super_WrappedInt<HalfCycles>.length_._0_4_ =
         (uint32_t)delay.super_WrappedInt<HalfCycles>.length_ - this->rom_start_;
    break;
  case IO:
    uVar2 = (uint32_t)delay.super_WrappedInt<HalfCycles>.length_ & 0xfffe;
    if (uVar2 != 0x8000) {
      if (((((((((((uVar2 == 0x8200) || (uVar2 == 0x8202)) || (uVar2 == 0x8204)) ||
                ((uVar2 == 0x8206 || (uVar2 == 0x8208)))) || (uVar2 == 0x820a)) ||
              (((uVar2 == 0x820c || (uVar2 == 0x820e)) ||
               ((uVar2 == 0x8210 || (((uVar2 == 0x8212 || (uVar2 == 0x8214)) || (uVar2 == 0x8216))))
               )))) || (((uVar2 == 0x8218 || (uVar2 == 0x821a)) ||
                        ((uVar2 == 0x821c ||
                         (((uVar2 == 0x821e || (uVar2 == 0x8220)) ||
                          ((uVar2 == 0x8222 ||
                           (((uVar2 == 0x8224 || (uVar2 == 0x8226)) || (uVar2 == 0x8228))))))))))))
            || ((uVar2 == 0x822a || (uVar2 == 0x822c)))) || (uVar2 == 0x822e)) ||
          ((((uVar2 == 0x8230 || (uVar2 == 0x8232)) ||
            ((uVar2 == 0x8234 ||
             ((((uVar2 == 0x8236 || (uVar2 == 0x8238)) || (uVar2 == 0x823a)) ||
              ((uVar2 == 0x823c || (uVar2 == 0x823e)))))))) || (uVar2 == 0x8240)))) ||
         (((uVar2 == 0x8242 || (uVar2 == 0x8244)) ||
          ((((((uVar2 == 0x8246 || (((uVar2 == 0x8248 || (uVar2 == 0x824a)) || (uVar2 == 0x824c))))
              || (((uVar2 == 0x824e || (uVar2 == 0x8250)) || (uVar2 == 0x8252)))) ||
             ((uVar2 == 0x8254 || (uVar2 == 0x8256)))) ||
            ((uVar2 == 0x8258 || (((uVar2 == 0x825a || (uVar2 == 0x825c)) || (uVar2 == 0x825e))))))
           || ((uVar2 == 0x8260 || (uVar2 == 0x8262)))))))) {
        bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
        if (!bVar1) {
          return (HalfCycles)TStack_68;
        }
        JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_98);
        this_00 = std::
                  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ::operator->((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                *)local_98);
        sVar4 = ST::Video::read(this_00,(uint32_t)delay.super_WrappedInt<HalfCycles>.length_ >> 1,
                                __buf,(size_t)__nbytes);
        CPU::MC68000::Microcycle<325U>::set_value16(cycle,(uint16_t)sVar4);
        std::
        unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_98);
      }
      else if (((uVar2 == 0x8604) || (uVar2 == 0x8606)) ||
              ((uVar2 == 0x8608 || ((uVar2 == 0x860a || (uVar2 == 0x860c)))))) {
        bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
        if (!bVar1) {
          return (HalfCycles)TStack_68;
        }
        JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_b8);
        this_01 = std::
                  unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ::operator->((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                *)local_b8);
        sVar4 = DMAController::read(this_01,(uint32_t)delay.super_WrappedInt<HalfCycles>.length_ >>
                                            1,__buf_00,(size_t)__nbytes);
        CPU::MC68000::Microcycle<325U>::set_value16(cycle,(uint16_t)sVar4);
        std::
        unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_b8);
      }
      else {
        if (((((((uVar2 == 0x8800) || (uVar2 == 0x8802)) || (uVar2 == 0x8804)) ||
              ((uVar2 == 0x8806 || (uVar2 == 0x8808)))) ||
             (((uVar2 == 0x880a || ((uVar2 == 0x880c || (uVar2 == 0x880e)))) || (uVar2 == 0x8810))))
            || ((((((uVar2 == 0x8812 || (uVar2 == 0x8814)) || (uVar2 == 0x8816)) ||
                  ((uVar2 == 0x8818 || (uVar2 == 0x881a)))) ||
                 ((uVar2 == 0x881c || ((uVar2 == 0x881e || (uVar2 == 0x8820)))))) ||
                ((uVar2 == 0x8822 ||
                 ((((uVar2 == 0x8824 || (uVar2 == 0x8826)) || (uVar2 == 0x8828)) ||
                  (((uVar2 == 0x882a || (uVar2 == 0x882c)) ||
                   ((uVar2 == 0x882e || ((uVar2 == 0x8830 || (uVar2 == 0x8832)))))))))))))) ||
           ((((uVar2 == 0x8834 ||
              ((((((((uVar2 == 0x8836 || (uVar2 == 0x8838)) || (uVar2 == 0x883a)) ||
                   ((uVar2 == 0x883c || (uVar2 == 0x883e)))) || (uVar2 == 0x8840)) ||
                 ((uVar2 == 0x8842 || (uVar2 == 0x8844)))) ||
                ((uVar2 == 0x8846 || (((uVar2 == 0x8848 || (uVar2 == 0x884a)) || (uVar2 == 0x884c)))
                 ))) || ((((uVar2 == 0x884e || (uVar2 == 0x8850)) ||
                          ((uVar2 == 0x8852 ||
                           (((uVar2 == 0x8854 || (uVar2 == 0x8856)) ||
                            ((uVar2 == 0x8858 ||
                             (((uVar2 == 0x885a || (uVar2 == 0x885c)) || (uVar2 == 0x885e))))))))))
                         || ((uVar2 == 0x8860 || (uVar2 == 0x8862)))))))) ||
             ((uVar2 == 0x8864 ||
              (((((uVar2 == 0x8866 || (uVar2 == 0x8868)) ||
                 ((uVar2 == 0x886a ||
                  ((((uVar2 == 0x886c || (uVar2 == 0x886e)) || (uVar2 == 0x8870)) ||
                   ((uVar2 == 0x8872 || (uVar2 == 0x8874)))))))) || (uVar2 == 0x8876)) ||
               ((uVar2 == 0x8878 || (uVar2 == 0x887a)))))))) ||
            (((((((uVar2 == 0x887c ||
                  (((uVar2 == 0x887e || (uVar2 == 0x8880)) || (uVar2 == 0x8882)))) ||
                 (((uVar2 == 0x8884 || (uVar2 == 0x8886)) || (uVar2 == 0x8888)))) ||
                (((uVar2 == 0x888a || (uVar2 == 0x888c)) ||
                 ((uVar2 == 0x888e ||
                  (((uVar2 == 0x8890 || (uVar2 == 0x8892)) || (uVar2 == 0x8894)))))))) ||
               (((uVar2 == 0x8896 || (uVar2 == 0x8898)) ||
                ((((uVar2 == 0x889a ||
                   (((uVar2 == 0x889c || (uVar2 == 0x889e)) ||
                    ((uVar2 == 0x88a0 ||
                     ((((uVar2 == 0x88a2 || (uVar2 == 0x88a4)) || (uVar2 == 0x88a6)) ||
                      ((uVar2 == 0x88a8 || (uVar2 == 0x88aa)))))))))) || (uVar2 == 0x88ac)) ||
                 (((uVar2 == 0x88ae || (uVar2 == 0x88b0)) ||
                  ((((uVar2 == 0x88b2 ||
                     (((uVar2 == 0x88b4 || (uVar2 == 0x88b6)) || (uVar2 == 35000)))) ||
                    (((uVar2 == 0x88ba || (uVar2 == 0x88bc)) || (uVar2 == 0x88be)))) ||
                   ((uVar2 == 0x88c0 || (uVar2 == 0x88c2)))))))))))) ||
              (((uVar2 == 0x88c4 || (((uVar2 == 0x88c6 || (uVar2 == 0x88c8)) || (uVar2 == 0x88ca))))
               || ((uVar2 == 0x88cc || (uVar2 == 0x88ce)))))) ||
             ((((uVar2 == 0x88d0 ||
                (((uVar2 == 0x88d2 || (uVar2 == 0x88d4)) ||
                 ((uVar2 == 0x88d6 ||
                  (((((uVar2 == 0x88d8 || (uVar2 == 0x88da)) || (uVar2 == 0x88dc)) ||
                    ((uVar2 == 0x88de || (uVar2 == 0x88e0)))) || (uVar2 == 0x88e2)))))))) ||
               ((((uVar2 == 0x88e4 || (uVar2 == 0x88e6)) || (uVar2 == 0x88e8)) ||
                (((uVar2 == 0x88ea || (uVar2 == 0x88ec)) || (uVar2 == 0x88ee)))))) ||
              (((((uVar2 == 0x88f0 || (uVar2 == 0x88f2)) ||
                 ((uVar2 == 0x88f4 || ((uVar2 == 0x88f6 || (uVar2 == 0x88f8)))))) ||
                (uVar2 == 0x88fa)) || ((uVar2 == 0x88fc || (uVar2 == 0x88fe)))))))))))) {
          bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
          if (!bVar1) {
            return (HalfCycles)TStack_68;
          }
          HalfCycles::HalfCycles(local_d0,2);
          advance_time(this,local_d0[0]);
          update_audio(this);
          v = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&this->ay_);
          CPU::MC68000::Microcycle<325U>::set_value8_high(cycle,v);
          HalfCycles::HalfCycles((HalfCycles *)(local_e8 + 0x10),2);
          HVar3 = WrappedInt<HalfCycles>::operator+
                            ((WrappedInt<HalfCycles> *)&stack0xffffffffffffff98,
                             (HalfCycles *)(local_e8 + 0x10));
          return (HalfCycles)HVar3.super_WrappedInt<HalfCycles>.length_.length_;
        }
        if ((((((((uVar2 == 64000) || (uVar2 == 0xfa02)) || (uVar2 == 0xfa04)) ||
               (((uVar2 == 0xfa06 || (uVar2 == 0xfa08)) ||
                ((uVar2 == 0xfa0a || ((uVar2 == 0xfa0c || (uVar2 == 0xfa0e)))))))) ||
              (uVar2 == 0xfa10)) ||
             ((((uVar2 == 0xfa12 || (uVar2 == 0xfa14)) || (uVar2 == 0xfa16)) ||
              ((uVar2 == 0xfa18 || (uVar2 == 0xfa1a)))))) ||
            (((((uVar2 == 0xfa1c || ((uVar2 == 0xfa1e || (uVar2 == 0xfa20)))) || (uVar2 == 0xfa22))
              || (((uVar2 == 0xfa24 || (uVar2 == 0xfa26)) || (uVar2 == 0xfa28)))) ||
             (((uVar2 == 0xfa2a || (uVar2 == 0xfa2c)) ||
              ((uVar2 == 0xfa2e || ((uVar2 == 0xfa30 || (uVar2 == 0xfa32)))))))))) ||
           ((uVar2 == 0xfa34 ||
            ((((uVar2 == 0xfa36 || (uVar2 == 0xfa38)) || (uVar2 == 0xfa3a)) ||
             ((uVar2 == 0xfa3c || (uVar2 == 0xfa3e)))))))) {
          bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
          if (!bVar1) {
            return (HalfCycles)TStack_68;
          }
          JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
                    ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)
                     local_e8);
          this_02 = std::
                    unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                    ::operator->((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                                  *)local_e8);
          sVar4 = Motorola::MFP68901::MFP68901::read
                            (this_02,(uint32_t)delay.super_WrappedInt<HalfCycles>.length_ >> 1,
                             __buf_01,(size_t)__nbytes);
          CPU::MC68000::Microcycle<325U>::set_value8_low(cycle,(uint8_t)sVar4);
          std::
          unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                         *)local_e8);
        }
        else if (((uVar2 == 0xfc00) || (uVar2 == 0xfc02)) ||
                ((uVar2 == 0xfc04 || (uVar2 == 0xfc06)))) {
          bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
          CPU::MC68000::Processor<Atari::ST::ConcreteMachine,_true,_true,_false>::
          set_is_peripheral_address(&this->mc68000_,(bool)((bVar1 ^ 0xffU) & 1));
          bVar1 = CPU::MC68000::Microcycle<325U>::data_select_active(cycle);
          if (!bVar1) {
            return (HalfCycles)TStack_68;
          }
          if (((uint32_t)delay.super_WrappedInt<HalfCycles>.length_ & 4) == 0) {
            local_200 = &this->keyboard_acia_;
          }
          else {
            local_200 = &this->midi_acia_;
          }
          local_110._16_8_ = local_200;
          JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
                    ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110);
          this_03 = std::
                    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                    ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                                  *)local_110);
          sVar4 = Motorola::ACIA::ACIA::read
                            (this_03,(uint32_t)delay.super_WrappedInt<HalfCycles>.length_ >> 1,
                             __buf_02,(size_t)__nbytes);
          CPU::MC68000::Microcycle<325U>::set_value8_high(cycle,(uint8_t)sVar4);
          std::
          unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                         *)local_110);
        }
      }
    }
    HalfCycles::HalfCycles((HalfCycles *)&this_local,0);
    return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
  }
  (cycle->value->field_1).b =
       *(uchar *)((long)&(((HalfCycles *)local_98._16_8_)->super_WrappedInt<HalfCycles>).length_ +
                 (ulong)(uint32_t)delay.super_WrappedInt<HalfCycles>.length_);
  HalfCycles::HalfCycles((HalfCycles *)&this_local,0);
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int is_supervisor) {
			// Just in case the last cycle was an interrupt acknowledge or bus error. TODO: find a better solution?
			mc68000_.set_is_peripheral_address(false);
			mc68000_.set_bus_error(false);

			// Advance time.
			advance_time(cycle.length);

			// Check for assertion of reset.
			if(cycle.operation & CPU::MC68000::Operation::Reset) {
				logger.error().append("Unhandled Reset");
			}

			// A null cycle leaves nothing else to do.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return HalfCycles(0);

			// An interrupt acknowledge, perhaps?
			if(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge) {
				// Current implementation: everything other than 6 (i.e. the MFP) is autovectored.
				const int interrupt_level = cycle.word_address()&7;
				if(interrupt_level != 6) {
					video_interrupts_pending_ &= ~interrupt_level;
					update_interrupt_input();
					mc68000_.set_is_peripheral_address(true);
					return HalfCycles(0);
				} else {
					if(cycle.operation & CPU::MC68000::Operation::SelectByte) {
						const int interrupt = mfp_->acknowledge_interrupt();
						if(interrupt != Motorola::MFP68901::MFP68901::NoAcknowledgement) {
							cycle.value->b = uint8_t(interrupt);
						} else {
							// TODO: this should take a while. Find out how long.
							mc68000_.set_bus_error(true);
						}
					}
					return HalfCycles(0);
				}
			}

			auto address = cycle.host_endian_byte_address();

			// If this is a new strobing of the address signal, test for bus error and pre-DTack delay.
			HalfCycles delay(0);
			if(cycle.operation & CPU::MC68000::Operation::NewAddress) {
				// Bus error test.
				if(
					// Anything unassigned should generate a bus error.
					(memory_map_[address >> 16] == BusDevice::Unassigned) ||

					// Bus errors also apply to unprivileged access to the first 0x800 bytes, or the IO area.
					(!is_supervisor && (address < 0x800 || memory_map_[address >> 16] == BusDevice::IO))
				) {
					mc68000_.set_bus_error(true);
					return delay;	// TODO: there should be an extra delay here.
				}

				// DTack delay rule: if accessing RAM or the shifter, align with the two cycles next available
				// for the CPU to access that side of the bus.
				if(address < ram_.size() || (address == 0xff8260)) {
					// DTack will be implicit; work out how long until that should be,
					// and apply bus error constraints.
					const int i_phase = bus_phase_.as<int>() & 7;
					if(i_phase < 4) {
						delay = HalfCycles(4 - i_phase);
						advance_time(delay);
					}
				}
			}

			uint8_t *memory = nullptr;
			switch(memory_map_[address >> 16]) {
				default:
				case BusDevice::RAM:
					memory = ram_.data();
				break;

				case BusDevice::ROM:
					memory = rom_.data();
					if(!(cycle.operation & CPU::MC68000::Operation::Read)) {
						return delay;
					}
					address -= rom_start_;
				break;

				case BusDevice::Floating:
					// TODO: provide vapour reads here. But: will these always be of the last video fetch?
				case BusDevice::Unassigned:
				case BusDevice::Cartridge:
					/*
						TOS 1.0 appears to attempt to read from the catridge before it has setup
						the bus error vector. Therefore I assume no bus error flows.
					*/
					switch(cycle.operation & (CPU::MC68000::Operation::SelectWord | CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::Read)) {
						default: break;
						case CPU::MC68000::Operation::SelectWord | CPU::MC68000::Operation::Read:
							cycle.value->w = 0xffff;
						break;
						case CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::Read:
							cycle.value->b = 0xff;
						break;
					}
				return delay;

				case BusDevice::IO:
					switch(address & 0xfffe) {	// TODO: surely it's going to be even less precise than this?
						default:
//							assert(false);

						case 0x8000:
							/* Memory controller configuration:
									b0, b1: bank 1
									b2, b3: bank 0

									00 = 128k
									01 = 512k
									10 = 2mb
									11 = reserved
							*/
						break;

						// Video controls.
						case 0x8200:	case 0x8202:	case 0x8204:	case 0x8206:
						case 0x8208:	case 0x820a:	case 0x820c:	case 0x820e:
						case 0x8210:	case 0x8212:	case 0x8214:	case 0x8216:
						case 0x8218:	case 0x821a:	case 0x821c:	case 0x821e:
						case 0x8220:	case 0x8222:	case 0x8224:	case 0x8226:
						case 0x8228:	case 0x822a:	case 0x822c:	case 0x822e:
						case 0x8230:	case 0x8232:	case 0x8234:	case 0x8236:
						case 0x8238:	case 0x823a:	case 0x823c:	case 0x823e:
						case 0x8240:	case 0x8242:	case 0x8244:	case 0x8246:
						case 0x8248:	case 0x824a:	case 0x824c:	case 0x824e:
						case 0x8250:	case 0x8252:	case 0x8254:	case 0x8256:
						case 0x8258:	case 0x825a:	case 0x825c:	case 0x825e:
						case 0x8260:	case 0x8262:
							if(!cycle.data_select_active()) return delay;

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(video_->read(int(address >> 1)));
							} else {
								video_->write(int(address >> 1), cycle.value16());
							}
						break;

						// DMA.
						case 0x8604:	case 0x8606:	case 0x8608:	case 0x860a:	case 0x860c:
							if(!cycle.data_select_active()) return delay;

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(dma_->read(int(address >> 1)));
							} else {
								dma_->write(int(address >> 1), cycle.value16());
							}
						break;

						// Audio.
						//
						// Re: mirrors, Dan Hollis' hardware register list asserts:
						//
						// "Note: PSG Registers are now fixed at these addresses. All other addresses are masked out on the Falcon. Any
						// writes to the shadow registers $8804-$88FF will cause bus errors.", which I am taking to imply that those shadow
						// registers exist on the Atari ST.
						case 0x8800: case 0x8802: case 0x8804: case 0x8806: case 0x8808: case 0x880a: case 0x880c: case 0x880e:
						case 0x8810: case 0x8812: case 0x8814: case 0x8816: case 0x8818: case 0x881a: case 0x881c: case 0x881e:
						case 0x8820: case 0x8822: case 0x8824: case 0x8826: case 0x8828: case 0x882a: case 0x882c: case 0x882e:
						case 0x8830: case 0x8832: case 0x8834: case 0x8836: case 0x8838: case 0x883a: case 0x883c: case 0x883e:
						case 0x8840: case 0x8842: case 0x8844: case 0x8846: case 0x8848: case 0x884a: case 0x884c: case 0x884e:
						case 0x8850: case 0x8852: case 0x8854: case 0x8856: case 0x8858: case 0x885a: case 0x885c: case 0x885e:
						case 0x8860: case 0x8862: case 0x8864: case 0x8866: case 0x8868: case 0x886a: case 0x886c: case 0x886e:
						case 0x8870: case 0x8872: case 0x8874: case 0x8876: case 0x8878: case 0x887a: case 0x887c: case 0x887e:
						case 0x8880: case 0x8882: case 0x8884: case 0x8886: case 0x8888: case 0x888a: case 0x888c: case 0x888e:
						case 0x8890: case 0x8892: case 0x8894: case 0x8896: case 0x8898: case 0x889a: case 0x889c: case 0x889e:
						case 0x88a0: case 0x88a2: case 0x88a4: case 0x88a6: case 0x88a8: case 0x88aa: case 0x88ac: case 0x88ae:
						case 0x88b0: case 0x88b2: case 0x88b4: case 0x88b6: case 0x88b8: case 0x88ba: case 0x88bc: case 0x88be:
						case 0x88c0: case 0x88c2: case 0x88c4: case 0x88c6: case 0x88c8: case 0x88ca: case 0x88cc: case 0x88ce:
						case 0x88d0: case 0x88d2: case 0x88d4: case 0x88d6: case 0x88d8: case 0x88da: case 0x88dc: case 0x88de:
						case 0x88e0: case 0x88e2: case 0x88e4: case 0x88e6: case 0x88e8: case 0x88ea: case 0x88ec: case 0x88ee:
						case 0x88f0: case 0x88f2: case 0x88f4: case 0x88f6: case 0x88f8: case 0x88fa: case 0x88fc: case 0x88fe:
							if(!cycle.data_select_active()) return delay;

							advance_time(HalfCycles(2));
							update_audio();

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high(GI::AY38910::Utility::read(ay_));
							} else {
								// Net effect here: addresses with bit 1 set write to a register,
								// addresses with bit 1 clear select a register.
								GI::AY38910::Utility::write(ay_, address&2, cycle.value8_high());
							}
						return delay + HalfCycles(2);

						// The MFP block:
						case 0xfa00:	case 0xfa02:	case 0xfa04:	case 0xfa06:
						case 0xfa08:	case 0xfa0a:	case 0xfa0c:	case 0xfa0e:
						case 0xfa10:	case 0xfa12:	case 0xfa14:	case 0xfa16:
						case 0xfa18:	case 0xfa1a:	case 0xfa1c:	case 0xfa1e:
						case 0xfa20:	case 0xfa22:	case 0xfa24:	case 0xfa26:
						case 0xfa28:	case 0xfa2a:	case 0xfa2c:	case 0xfa2e:
						case 0xfa30:	case 0xfa32:	case 0xfa34:	case 0xfa36:
						case 0xfa38:	case 0xfa3a:	case 0xfa3c:	case 0xfa3e:
							if(!cycle.data_select_active()) return delay;

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_low(mfp_->read(int(address >> 1)));
							} else {
								mfp_->write(int(address >> 1), cycle.value8_low());
							}
						break;

						// ACIAs.
						case 0xfc00:	case 0xfc02:	case 0xfc04:	case 0xfc06: {
							// Set VPA.
							mc68000_.set_is_peripheral_address(!cycle.data_select_active());
							if(!cycle.data_select_active()) return delay;

							const auto acia_ = (address & 4) ? &midi_acia_ : &keyboard_acia_;
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high((*acia_)->read(int(address >> 1)));
							} else {
								(*acia_)->write(int(address >> 1), cycle.value8_high());
							}
						} break;
					}
				return HalfCycles(0);
			}

			// If control has fallen through to here, the access is either a read from ROM, or a read or write to RAM.
			//
			// In both write cases, immediately reinstall the first eight bytes of RAM from ROM, so that any write to
			// that area is in effect a no-op. This is cheaper than the conditionality of actually checking.
			switch(cycle.operation & (CPU::MC68000::Operation::SelectWord | CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::Read)) {
				default:
				break;

				case CPU::MC68000::Operation::SelectWord | CPU::MC68000::Operation::Read:
					cycle.value->w = *reinterpret_cast<uint16_t *>(&memory[address]);
				break;
				case CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::Read:
					cycle.value->b = memory[address];
				break;
				case CPU::MC68000::Operation::SelectWord:
					if(address >= video_range_.low_address && address < video_range_.high_address)
						video_.flush();
					*reinterpret_cast<uint16_t *>(&memory[address]) = cycle.value->w;
					reinstall_rom_vector();
				break;
				case CPU::MC68000::Operation::SelectByte:
					if(address >= video_range_.low_address && address < video_range_.high_address)
						video_.flush();
					memory[address] = cycle.value->b;
					reinstall_rom_vector();
				break;
			}

			return HalfCycles(0);
		}